

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd64_transform_kernel_pack8_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  float *pfVar48;
  float *pfVar49;
  float *pfVar50;
  float *pfVar51;
  float *pfVar52;
  float *pfVar53;
  float *pfVar54;
  float *pfVar55;
  float *pfVar56;
  float *pfVar57;
  float *pfVar58;
  float *pfVar59;
  Mat *pMVar60;
  Mat *pMVar61;
  float *pfVar62;
  float *pfVar63;
  float *pfVar64;
  int in_ECX;
  long lVar65;
  int in_EDX;
  Mat *in_RDI;
  float *k77;
  float *k76;
  float *k75;
  float *k74;
  float *k73;
  float *k72;
  float *k71;
  float *k70;
  float *k67;
  float *k66;
  float *k65;
  float *k64;
  float *k63;
  float *k62;
  float *k61;
  float *k60;
  float *k57;
  float *k56;
  float *k55;
  float *k54;
  float *k53;
  float *k52;
  float *k51;
  float *k50;
  float *k47;
  float *k46;
  float *k45;
  float *k44;
  float *k43;
  float *k42;
  float *k41;
  float *k40;
  float *k37;
  float *k36;
  float *k35;
  float *k34;
  float *k33;
  float *k32;
  float *k31;
  float *k30;
  float *k27;
  float *k26;
  float *k25;
  float *k24;
  float *k23;
  float *k22;
  float *k21;
  float *k20;
  float *k17;
  float *k16;
  float *k15;
  float *k14;
  float *k13;
  float *k12;
  float *k11;
  float *k10;
  float *k07;
  float *k06;
  float *k05;
  float *k04;
  float *k03;
  float *k02;
  float *k01;
  float *k00;
  int p_1;
  float *g00;
  int k;
  Mat g0;
  Mat k7;
  Mat k6;
  Mat k5;
  Mat k4;
  Mat k3;
  Mat k2_1;
  Mat k1_1;
  Mat k0_1;
  int q;
  int i_1;
  float *tmpp;
  int j;
  int i;
  float tmp [8] [3];
  float *k2;
  float *k1;
  float *k0;
  float *kernel_tm0;
  float *kernel0;
  int q_1;
  int p;
  float ktm [8] [3];
  Mat kernel_tm;
  undefined4 in_stack_fffffffffffff770;
  int in_stack_fffffffffffff774;
  size_t in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff788;
  Mat *in_stack_fffffffffffff790;
  Mat *in_stack_fffffffffffff798;
  Allocator *in_stack_fffffffffffff7a0;
  int local_46c;
  float *local_468;
  int local_45c;
  Mat local_458;
  Mat local_410;
  Mat local_3c8;
  Mat local_380;
  Mat local_338;
  Mat local_2f0;
  Mat local_2a8;
  Mat local_260;
  Mat local_218;
  int local_1d0;
  int local_1cc;
  float *local_1c8;
  int local_1c0;
  int local_1bc;
  float local_1b8 [26];
  float *local_150;
  float *local_148;
  float *local_140;
  Mat local_138;
  float *local_f0;
  float *local_e8;
  int local_e0;
  int local_dc;
  float local_d8 [28];
  Mat local_68;
  int local_18;
  int local_14;
  Mat *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  Mat::Mat(&local_68);
  Mat::create(in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
              (int)in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20),
              in_stack_fffffffffffff778,
              (Allocator *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  memcpy(local_d8,&DAT_00951980,0x60);
  for (local_dc = 0; local_dc < local_18; local_dc = local_dc + 1) {
    for (local_e0 = 0; local_e0 < local_14; local_e0 = local_e0 + 1) {
      local_e8 = Mat::operator_cast_to_float_(local_8);
      local_e8 = local_e8 + (long)(local_dc * local_14 * 9) + (long)(local_e0 * 9);
      Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
      pfVar1 = Mat::row(&local_138,local_e0);
      Mat::~Mat((Mat *)0x2b0eb4);
      local_140 = local_e8;
      local_148 = local_e8 + 3;
      local_150 = local_e8 + 6;
      for (local_1bc = 0; local_1bc < 8; local_1bc = local_1bc + 1) {
        local_1b8[(long)local_1bc * 3] =
             *local_e8 * local_d8[(long)local_1bc * 3] +
             local_e8[1] * local_d8[(long)local_1bc * 3 + 1] +
             local_e8[2] * local_d8[(long)local_1bc * 3 + 2];
        local_1b8[(long)local_1bc * 3 + 1] =
             *local_148 * local_d8[(long)local_1bc * 3] +
             local_e8[4] * local_d8[(long)local_1bc * 3 + 1] +
             local_e8[5] * local_d8[(long)local_1bc * 3 + 2];
        local_1b8[(long)local_1bc * 3 + 2] =
             *local_150 * local_d8[(long)local_1bc * 3] +
             local_e8[7] * local_d8[(long)local_1bc * 3 + 1] +
             local_e8[8] * local_d8[(long)local_1bc * 3 + 2];
      }
      for (local_1c0 = 0; local_1c0 < 8; local_1c0 = local_1c0 + 1) {
        lVar65 = (long)local_1c0;
        local_1c8 = local_1b8 + lVar65 * 3;
        for (local_1cc = 0; local_1cc < 8; local_1cc = local_1cc + 1) {
          pfVar1[local_1c0 * 8 + local_1cc] =
               *local_1c8 * local_d8[(long)local_1cc * 3] +
               local_1b8[lVar65 * 3 + 1] * local_d8[(long)local_1cc * 3 + 1] +
               local_1b8[lVar65 * 3 + 2] * local_d8[(long)local_1cc * 3 + 2];
        }
      }
      local_f0 = pfVar1;
    }
  }
  Mat::create(in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
              (int)in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20),
              in_stack_fffffffffffff778,in_stack_fffffffffffff774,in_stack_fffffffffffff7a0);
  for (local_1d0 = 0; local_1d0 + 7 < local_18; local_1d0 = local_1d0 + 8) {
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    Mat::channel(in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
    for (local_45c = 0; local_45c < 0x40; local_45c = local_45c + 1) {
      local_468 = Mat::row(&local_458,local_45c);
      for (local_46c = 0; local_46c + 7 < local_14; local_46c = local_46c + 8) {
        pfVar1 = Mat::row(&local_218,local_46c);
        pfVar2 = Mat::row(&local_218,local_46c + 1);
        pfVar3 = Mat::row(&local_218,local_46c + 2);
        pfVar4 = Mat::row(&local_218,local_46c + 3);
        pfVar5 = Mat::row(&local_218,local_46c + 4);
        pfVar6 = Mat::row(&local_218,local_46c + 5);
        pfVar7 = Mat::row(&local_218,local_46c + 6);
        pfVar8 = Mat::row(&local_218,local_46c + 7);
        pfVar9 = Mat::row(&local_260,local_46c);
        pfVar10 = Mat::row(&local_260,local_46c + 1);
        pfVar11 = Mat::row(&local_260,local_46c + 2);
        pfVar12 = Mat::row(&local_260,local_46c + 3);
        pfVar13 = Mat::row(&local_260,local_46c + 4);
        pfVar14 = Mat::row(&local_260,local_46c + 5);
        pfVar15 = Mat::row(&local_260,local_46c + 6);
        pfVar16 = Mat::row(&local_260,local_46c + 7);
        pfVar17 = Mat::row(&local_2a8,local_46c);
        pfVar18 = Mat::row(&local_2a8,local_46c + 1);
        pfVar19 = Mat::row(&local_2a8,local_46c + 2);
        pfVar20 = Mat::row(&local_2a8,local_46c + 3);
        pfVar21 = Mat::row(&local_2a8,local_46c + 4);
        pfVar22 = Mat::row(&local_2a8,local_46c + 5);
        pfVar23 = Mat::row(&local_2a8,local_46c + 6);
        pfVar24 = Mat::row(&local_2a8,local_46c + 7);
        pfVar25 = Mat::row(&local_2f0,local_46c);
        pfVar26 = Mat::row(&local_2f0,local_46c + 1);
        pfVar27 = Mat::row(&local_2f0,local_46c + 2);
        pfVar28 = Mat::row(&local_2f0,local_46c + 3);
        pfVar29 = Mat::row(&local_2f0,local_46c + 4);
        pfVar30 = Mat::row(&local_2f0,local_46c + 5);
        pfVar31 = Mat::row(&local_2f0,local_46c + 6);
        pfVar32 = Mat::row(&local_2f0,local_46c + 7);
        pfVar33 = Mat::row(&local_338,local_46c);
        pfVar34 = Mat::row(&local_338,local_46c + 1);
        pfVar35 = Mat::row(&local_338,local_46c + 2);
        pfVar36 = Mat::row(&local_338,local_46c + 3);
        pfVar37 = Mat::row(&local_338,local_46c + 4);
        pfVar38 = Mat::row(&local_338,local_46c + 5);
        pfVar39 = Mat::row(&local_338,local_46c + 6);
        pfVar40 = Mat::row(&local_338,local_46c + 7);
        pfVar41 = Mat::row(&local_380,local_46c);
        pfVar42 = Mat::row(&local_380,local_46c + 1);
        pfVar43 = Mat::row(&local_380,local_46c + 2);
        pfVar44 = Mat::row(&local_380,local_46c + 3);
        pfVar45 = Mat::row(&local_380,local_46c + 4);
        pfVar46 = Mat::row(&local_380,local_46c + 5);
        pfVar47 = Mat::row(&local_380,local_46c + 6);
        pfVar48 = Mat::row(&local_380,local_46c + 7);
        pfVar49 = Mat::row(&local_3c8,local_46c);
        pfVar50 = Mat::row(&local_3c8,local_46c + 1);
        pfVar51 = Mat::row(&local_3c8,local_46c + 2);
        pfVar52 = Mat::row(&local_3c8,local_46c + 3);
        pfVar53 = Mat::row(&local_3c8,local_46c + 4);
        pfVar54 = Mat::row(&local_3c8,local_46c + 5);
        pfVar55 = Mat::row(&local_3c8,local_46c + 6);
        pfVar56 = Mat::row(&local_3c8,local_46c + 7);
        pfVar57 = Mat::row(&local_410,local_46c);
        pfVar58 = Mat::row(&local_410,local_46c + 1);
        pfVar59 = Mat::row(&local_410,local_46c + 2);
        pMVar60 = (Mat *)Mat::row(&local_410,local_46c + 3);
        in_stack_fffffffffffff798 = pMVar60;
        pMVar61 = (Mat *)Mat::row(&local_410,local_46c + 4);
        in_stack_fffffffffffff790 = pMVar61;
        pfVar62 = Mat::row(&local_410,local_46c + 5);
        pfVar63 = Mat::row(&local_410,local_46c + 6);
        pfVar64 = Mat::row(&local_410,local_46c + 7);
        *local_468 = pfVar1[local_45c];
        local_468[1] = pfVar9[local_45c];
        local_468[2] = pfVar17[local_45c];
        local_468[3] = pfVar25[local_45c];
        local_468[4] = pfVar33[local_45c];
        local_468[5] = pfVar41[local_45c];
        local_468[6] = pfVar49[local_45c];
        local_468[7] = pfVar57[local_45c];
        local_468[8] = pfVar2[local_45c];
        local_468[9] = pfVar10[local_45c];
        local_468[10] = pfVar18[local_45c];
        local_468[0xb] = pfVar26[local_45c];
        local_468[0xc] = pfVar34[local_45c];
        local_468[0xd] = pfVar42[local_45c];
        local_468[0xe] = pfVar50[local_45c];
        local_468[0xf] = pfVar58[local_45c];
        local_468[0x10] = pfVar3[local_45c];
        local_468[0x11] = pfVar11[local_45c];
        local_468[0x12] = pfVar19[local_45c];
        local_468[0x13] = pfVar27[local_45c];
        local_468[0x14] = pfVar35[local_45c];
        local_468[0x15] = pfVar43[local_45c];
        local_468[0x16] = pfVar51[local_45c];
        local_468[0x17] = pfVar59[local_45c];
        local_468[0x18] = pfVar4[local_45c];
        local_468[0x19] = pfVar12[local_45c];
        local_468[0x1a] = pfVar20[local_45c];
        local_468[0x1b] = pfVar28[local_45c];
        local_468[0x1c] = pfVar36[local_45c];
        local_468[0x1d] = pfVar44[local_45c];
        local_468[0x1e] = pfVar52[local_45c];
        local_468[0x1f] = *(float *)((long)&pMVar60->data + (long)local_45c * 4);
        local_468[0x20] = pfVar5[local_45c];
        local_468[0x21] = pfVar13[local_45c];
        local_468[0x22] = pfVar21[local_45c];
        local_468[0x23] = pfVar29[local_45c];
        local_468[0x24] = pfVar37[local_45c];
        local_468[0x25] = pfVar45[local_45c];
        local_468[0x26] = pfVar53[local_45c];
        local_468[0x27] = *(float *)((long)&pMVar61->data + (long)local_45c * 4);
        local_468[0x28] = pfVar6[local_45c];
        local_468[0x29] = pfVar14[local_45c];
        local_468[0x2a] = pfVar22[local_45c];
        local_468[0x2b] = pfVar30[local_45c];
        local_468[0x2c] = pfVar38[local_45c];
        local_468[0x2d] = pfVar46[local_45c];
        local_468[0x2e] = pfVar54[local_45c];
        local_468[0x2f] = pfVar62[local_45c];
        local_468[0x30] = pfVar7[local_45c];
        local_468[0x31] = pfVar15[local_45c];
        local_468[0x32] = pfVar23[local_45c];
        local_468[0x33] = pfVar31[local_45c];
        local_468[0x34] = pfVar39[local_45c];
        local_468[0x35] = pfVar47[local_45c];
        local_468[0x36] = pfVar55[local_45c];
        local_468[0x37] = pfVar63[local_45c];
        local_468[0x38] = pfVar8[local_45c];
        local_468[0x39] = pfVar16[local_45c];
        local_468[0x3a] = pfVar24[local_45c];
        local_468[0x3b] = pfVar32[local_45c];
        local_468[0x3c] = pfVar40[local_45c];
        local_468[0x3d] = pfVar48[local_45c];
        local_468[0x3e] = pfVar56[local_45c];
        local_468[0x3f] = pfVar64[local_45c];
        local_468 = local_468 + 0x40;
      }
    }
    Mat::~Mat((Mat *)0x2b2a4d);
    Mat::~Mat((Mat *)0x2b2a5a);
    Mat::~Mat((Mat *)0x2b2a67);
    Mat::~Mat((Mat *)0x2b2a74);
    Mat::~Mat((Mat *)0x2b2a81);
    Mat::~Mat((Mat *)0x2b2a8e);
    Mat::~Mat((Mat *)0x2b2a9b);
    Mat::~Mat((Mat *)0x2b2aa8);
    Mat::~Mat((Mat *)0x2b2ab5);
  }
  Mat::~Mat((Mat *)0x2b2b42);
  return;
}

Assistant:

static void conv3x3s1_winograd64_transform_kernel_pack8_avx(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
    // interleave
    // src = 64-inch-outch
    // dst = 8b-8a-inch/8a-64-outch/8b;
    kernel_tm_pack8.create(inch / 8, 64, outch / 8, (size_t)4u * 64, 64);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel_tm.channel(q);
        const Mat k1 = kernel_tm.channel(q + 1);
        const Mat k2 = kernel_tm.channel(q + 2);
        const Mat k3 = kernel_tm.channel(q + 3);
        const Mat k4 = kernel_tm.channel(q + 4);
        const Mat k5 = kernel_tm.channel(q + 5);
        const Mat k6 = kernel_tm.channel(q + 6);
        const Mat k7 = kernel_tm.channel(q + 7);

        Mat g0 = kernel_tm_pack8.channel(q / 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                const float* k00 = k0.row(p);
                const float* k01 = k0.row(p + 1);
                const float* k02 = k0.row(p + 2);
                const float* k03 = k0.row(p + 3);
                const float* k04 = k0.row(p + 4);
                const float* k05 = k0.row(p + 5);
                const float* k06 = k0.row(p + 6);
                const float* k07 = k0.row(p + 7);

                const float* k10 = k1.row(p);
                const float* k11 = k1.row(p + 1);
                const float* k12 = k1.row(p + 2);
                const float* k13 = k1.row(p + 3);
                const float* k14 = k1.row(p + 4);
                const float* k15 = k1.row(p + 5);
                const float* k16 = k1.row(p + 6);
                const float* k17 = k1.row(p + 7);

                const float* k20 = k2.row(p);
                const float* k21 = k2.row(p + 1);
                const float* k22 = k2.row(p + 2);
                const float* k23 = k2.row(p + 3);
                const float* k24 = k2.row(p + 4);
                const float* k25 = k2.row(p + 5);
                const float* k26 = k2.row(p + 6);
                const float* k27 = k2.row(p + 7);

                const float* k30 = k3.row(p);
                const float* k31 = k3.row(p + 1);
                const float* k32 = k3.row(p + 2);
                const float* k33 = k3.row(p + 3);
                const float* k34 = k3.row(p + 4);
                const float* k35 = k3.row(p + 5);
                const float* k36 = k3.row(p + 6);
                const float* k37 = k3.row(p + 7);

                const float* k40 = k4.row(p);
                const float* k41 = k4.row(p + 1);
                const float* k42 = k4.row(p + 2);
                const float* k43 = k4.row(p + 3);
                const float* k44 = k4.row(p + 4);
                const float* k45 = k4.row(p + 5);
                const float* k46 = k4.row(p + 6);
                const float* k47 = k4.row(p + 7);

                const float* k50 = k5.row(p);
                const float* k51 = k5.row(p + 1);
                const float* k52 = k5.row(p + 2);
                const float* k53 = k5.row(p + 3);
                const float* k54 = k5.row(p + 4);
                const float* k55 = k5.row(p + 5);
                const float* k56 = k5.row(p + 6);
                const float* k57 = k5.row(p + 7);

                const float* k60 = k6.row(p);
                const float* k61 = k6.row(p + 1);
                const float* k62 = k6.row(p + 2);
                const float* k63 = k6.row(p + 3);
                const float* k64 = k6.row(p + 4);
                const float* k65 = k6.row(p + 5);
                const float* k66 = k6.row(p + 6);
                const float* k67 = k6.row(p + 7);

                const float* k70 = k7.row(p);
                const float* k71 = k7.row(p + 1);
                const float* k72 = k7.row(p + 2);
                const float* k73 = k7.row(p + 3);
                const float* k74 = k7.row(p + 4);
                const float* k75 = k7.row(p + 5);
                const float* k76 = k7.row(p + 6);
                const float* k77 = k7.row(p + 7);

                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00[8] = k01[k];
                g00[9] = k11[k];
                g00[10] = k21[k];
                g00[11] = k31[k];
                g00[12] = k41[k];
                g00[13] = k51[k];
                g00[14] = k61[k];
                g00[15] = k71[k];

                g00[16] = k02[k];
                g00[17] = k12[k];
                g00[18] = k22[k];
                g00[19] = k32[k];
                g00[20] = k42[k];
                g00[21] = k52[k];
                g00[22] = k62[k];
                g00[23] = k72[k];

                g00[24] = k03[k];
                g00[25] = k13[k];
                g00[26] = k23[k];
                g00[27] = k33[k];
                g00[28] = k43[k];
                g00[29] = k53[k];
                g00[30] = k63[k];
                g00[31] = k73[k];

                g00[32] = k04[k];
                g00[33] = k14[k];
                g00[34] = k24[k];
                g00[35] = k34[k];
                g00[36] = k44[k];
                g00[37] = k54[k];
                g00[38] = k64[k];
                g00[39] = k74[k];

                g00[40] = k05[k];
                g00[41] = k15[k];
                g00[42] = k25[k];
                g00[43] = k35[k];
                g00[44] = k45[k];
                g00[45] = k55[k];
                g00[46] = k65[k];
                g00[47] = k75[k];

                g00[48] = k06[k];
                g00[49] = k16[k];
                g00[50] = k26[k];
                g00[51] = k36[k];
                g00[52] = k46[k];
                g00[53] = k56[k];
                g00[54] = k66[k];
                g00[55] = k76[k];

                g00[56] = k07[k];
                g00[57] = k17[k];
                g00[58] = k27[k];
                g00[59] = k37[k];
                g00[60] = k47[k];
                g00[61] = k57[k];
                g00[62] = k67[k];
                g00[63] = k77[k];

                g00 += 64;
            }
        }
    }
}